

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::~World(World *this)

{
  Map *this_00;
  Home *this_01;
  Board *this_02;
  EIF *this_03;
  ENF *this_04;
  ESF *this_05;
  ECF *this_06;
  GuildManager *this_07;
  bool bVar1;
  reference ppMVar2;
  reference ppHVar3;
  mapped_type *this_08;
  allocator local_91;
  key_type local_90;
  Board *local_70;
  value_type board;
  iterator __end1_2;
  iterator __begin1_2;
  array<Board_*,_8UL> *__range1_2;
  Home *home;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Home_*,_std::allocator<Home_*>_> *__range1_1;
  Map *map;
  iterator __end1;
  iterator __begin1;
  vector<Map_*,_std::allocator<Map_*>_> *__range1;
  World *this_local;
  
  __end1 = std::vector<Map_*,_std::allocator<Map_*>_>::begin(&this->maps);
  map = (Map *)std::vector<Map_*,_std::allocator<Map_*>_>::end(&this->maps);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>
                                     *)&map), bVar1) {
    ppMVar2 = __gnu_cxx::__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::
              operator*(&__end1);
    this_00 = *ppMVar2;
    if (this_00 != (Map *)0x0) {
      Map::~Map(this_00);
      operator_delete(this_00,0xd8);
    }
    __gnu_cxx::__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::operator++
              (&__end1);
  }
  __end1_1 = std::vector<Home_*,_std::allocator<Home_*>_>::begin(&this->homes);
  home = (Home *)std::vector<Home_*,_std::allocator<Home_*>_>::end(&this->homes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Home_**,_std::vector<Home_*,_std::allocator<Home_*>_>_>
                             *)&home), bVar1) {
    ppHVar3 = __gnu_cxx::__normal_iterator<Home_**,_std::vector<Home_*,_std::allocator<Home_*>_>_>::
              operator*(&__end1_1);
    this_01 = *ppHVar3;
    __range1_2 = (array<Board_*,_8UL> *)this_01;
    if (this_01 != (Home *)0x0) {
      Home::~Home(this_01);
      operator_delete(this_01,0x50);
    }
    __gnu_cxx::__normal_iterator<Home_**,_std::vector<Home_*,_std::allocator<Home_*>_>_>::operator++
              (&__end1_1);
  }
  __begin1_2 = (this->boards)._M_elems;
  __end1_2 = std::array<Board_*,_8UL>::begin((array<Board_*,_8UL> *)__begin1_2);
  board = (value_type)std::array<Board_*,_8UL>::end((array<Board_*,_8UL> *)__begin1_2);
  for (; (value_type)__end1_2 != board; __end1_2 = __end1_2 + 1) {
    this_02 = *__end1_2;
    local_70 = this_02;
    if (this_02 != (Board *)0x0) {
      Board::~Board(this_02);
      operator_delete(this_02,0x20);
    }
  }
  this_03 = this->eif;
  if (this_03 != (EIF *)0x0) {
    EIF::~EIF(this_03);
    operator_delete(this_03,0x20);
  }
  this_04 = this->enf;
  if (this_04 != (ENF *)0x0) {
    ENF::~ENF(this_04);
    operator_delete(this_04,0x20);
  }
  this_05 = this->esf;
  if (this_05 != (ESF *)0x0) {
    ESF::~ESF(this_05);
    operator_delete(this_05,0x20);
  }
  this_06 = this->ecf;
  if (this_06 != (ECF *)0x0) {
    ECF::~ECF(this_06);
    operator_delete(this_06,0x20);
  }
  this_07 = this->guildmanager;
  if (this_07 != (GuildManager *)0x0) {
    GuildManager::~GuildManager(this_07);
    operator_delete(this_07,0x80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"TimedSave",&local_91);
  this_08 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(this->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_90);
  bVar1 = util::variant::operator_cast_to_bool(this_08);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  if (bVar1) {
    Database::Commit(&this->db);
  }
  std::vector<int,_std::allocator<int>_>::~vector(&this->instrument_ids);
  std::
  map<short,_std::shared_ptr<Quest>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
  ::~map(&this->quests);
  std::vector<Home_*,_std::allocator<Home_*>_>::~vector(&this->homes);
  std::vector<Map_*,_std::allocator<Map_*>_>::~vector(&this->maps);
  std::vector<Party_*,_std::allocator<Party_*>_>::~vector(&this->parties);
  std::vector<Character_*,_std::allocator<Character_*>_>::~vector(&this->characters);
  I18N::~I18N(&this->i18n);
  Config::~Config(&this->skills_config);
  Config::~Config(&this->home_config);
  Config::~Config(&this->formulas_config);
  Config::~Config(&this->arenas_config);
  Config::~Config(&this->shops_config);
  Config::~Config(&this->drops_config);
  Config::~Config(&this->admin_config);
  Config::~Config(&this->config);
  std::
  vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ::~vector(&this->npc_data);
  Database::~Database(&this->db);
  Timer::~Timer(&this->timer);
  return;
}

Assistant:

World::~World()
{
	UTIL_FOREACH(this->maps, map)
	{
		delete map;
	}

	UTIL_FOREACH(this->homes, home)
	{
		delete home;
	}

	UTIL_FOREACH(this->boards, board)
	{
		delete board;
	}

	delete this->eif;
	delete this->enf;
	delete this->esf;
	delete this->ecf;

	delete this->guildmanager;

	if (this->config["TimedSave"])
	{
		this->db.Commit();
	}
}